

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O3

void __thiscall Pl_DCT::Pl_DCT(Pl_DCT *this,char *identifier,Pipeline *next)

{
  Members *pMVar1;
  logic_error *this_00;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_DCT_0033dee0;
  pMVar1 = (Members *)operator_new(0x58);
  pMVar1->action = a_decompress;
  Pl_Buffer::Pl_Buffer(&pMVar1->buf,"DCT compressed image",(Pipeline *)0x0);
  pMVar1->image_width = 0;
  pMVar1->image_height = 0;
  pMVar1->components = 1;
  pMVar1->color_space = JCS_GRAYSCALE;
  pMVar1->config_callback = (CompressConfig *)0x0;
  (this->m)._M_t.super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
  super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl = pMVar1;
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_DCT with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_DCT::Pl_DCT(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_DCT with nullptr as next");
    }
}